

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::AddLocalGenerator(cmGlobalGenerator *this,cmLocalGenerator *lg)

{
  int iVar1;
  cmState *this_00;
  char *__nptr;
  size_type sVar2;
  float local_84;
  float local_5c;
  float prog;
  int numGen;
  allocator local_41;
  string local_40;
  char *local_20;
  char *numGenC;
  cmLocalGenerator *lg_local;
  cmGlobalGenerator *this_local;
  
  numGenC = (char *)lg;
  lg_local = (cmLocalGenerator *)this;
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
            (&this->LocalGenerators,(value_type *)&numGenC);
  this_00 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_NUMBER_OF_LOCAL_GENERATORS",&local_41);
  __nptr = cmState::GetInitializedCacheValue(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = __nptr;
  if (__nptr == (char *)0x0) {
    this->FirstTimeProgress = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    if (0.95 < this->FirstTimeProgress) {
      this->FirstTimeProgress = 0.95;
    }
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",this->FirstTimeProgress);
  }
  else {
    iVar1 = atoi(__nptr);
    sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    local_84 = (float)sVar2;
    local_5c = (local_84 * 0.9) / (float)iVar1;
    if (0.9 < local_5c) {
      local_5c = 0.9;
    }
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",local_5c);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddLocalGenerator(cmLocalGenerator *lg)
{
  this->LocalGenerators.push_back(lg);

  // update progress
  // estimate how many lg there will be
  const char *numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue
    ("CMAKE_NUMBER_OF_LOCAL_GENERATORS");

  if (!numGenC)
    {
    // If CMAKE_NUMBER_OF_LOCAL_GENERATORS is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) /30.0f);
    if(this->FirstTimeProgress > 0.95f)
      {
      this->FirstTimeProgress = 0.95f;
      }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
    }

  int numGen = atoi(numGenC);
  float prog = 0.9f*static_cast<float>(this->LocalGenerators.size())/
    static_cast<float>(numGen);
  if (prog > 0.9f)
    {
    prog = 0.9f;
    }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}